

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5GetPoslistSize(u8 *p,int *pnSz,int *pbDel)

{
  int local_28;
  uint local_24;
  int n;
  int nSz;
  int *pbDel_local;
  int *pnSz_local;
  u8 *p_local;
  
  local_28 = 1;
  local_24 = (uint)*p;
  _n = (uint *)pbDel;
  pbDel_local = pnSz;
  if ((*p & 0x80) != 0) {
    pnSz_local = (int *)p;
    local_28 = sqlite3Fts5GetVarint32(p,&local_24);
  }
  *pbDel_local = (int)local_24 / 2;
  *_n = local_24 & 1;
  return local_28;
}

Assistant:

static int fts5GetPoslistSize(const u8 *p, int *pnSz, int *pbDel){
  int nSz;
  int n = 0;
  fts5FastGetVarint32(p, n, nSz);
  assert_nc( nSz>=0 );
  *pnSz = nSz/2;
  *pbDel = nSz & 0x0001;
  return n;
}